

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

int __thiscall kj::anon_unknown_9::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Type TVar2;
  Fault f;
  stat stats;
  Fault local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  stat64 local_b0;
  
  do {
    iVar1 = fstat64(*(int *)__file,&local_b0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    TVar2 = modeToType(local_b0.st_mode);
    (this->fd).fd = TVar2;
    *(__off_t *)(this + 2) = local_b0.st_size;
    *(__blkcnt64_t *)(this + 4) = local_b0.st_blocks << 9;
    *(__time_t *)(this + 6) = local_b0.st_mtim.tv_sec * 1000000000 + local_b0.st_mtim.tv_nsec;
    this[8].fd.fd = (int)local_b0.st_nlink;
    *(__dev_t *)(this + 10) = (local_b0.st_dev << 0x20 | local_b0.st_dev >> 0x20) ^ local_b0.st_ino;
    return (int)this;
  }
  local_d0.exception = (Exception *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  kj::_::Debug::Fault::init
            (&local_d0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_d0);
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }